

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_op_shl(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  TValue *io;
  GCObject *pGVar4;
  TValue *pTVar5;
  undefined8 in_R8;
  ulong uVar6;
  ushort uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar6 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
  pTVar5 = ra;
  if (rb->tt_ == 3) {
    dVar1 = (rb->value_).n;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar1;
    auVar9 = vroundsd_avx(auVar9,auVar9,9);
    dVar8 = auVar9._0_8_;
    if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) {
      uVar2 = vcmppd_avx512vl(auVar9,ZEXT816(0x43e0000000000000),5);
      uVar3 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar9,6);
      uVar6 = CONCAT44((int)((ulong)in_R8 >> 0x20),(uint)((ushort)uVar3 & 3 | (ushort)uVar2 & 3));
      pTVar5 = (TValue *)(long)dVar8;
    }
LAB_0013091b:
    if ((uVar6 & 1) != 0) goto LAB_0013097d;
  }
  else {
    if (rb->tt_ != 0x13) goto LAB_0013091b;
    pTVar5 = (TValue *)(rb->value_).i;
  }
  uVar7 = 1;
  if (rc->tt_ == 3) {
    dVar1 = (rc->value_).n;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    auVar9 = vroundsd_avx(auVar10,auVar10,9);
    dVar8 = auVar9._0_8_;
    if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) {
      uVar2 = vcmppd_avx512vl(auVar9,ZEXT816(0x43e0000000000000),5);
      uVar3 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar9,6);
      uVar7 = (ushort)uVar3 & 3 | (ushort)uVar2 & 3;
      uVar6 = (ulong)dVar8;
    }
  }
  else if (rc->tt_ == 0x13) {
    uVar6 = (rc->value_).i;
    goto LAB_00130991;
  }
  if ((uVar7 & 1) != 0) {
LAB_0013097d:
    luaT_trybinTM(L,rb,rc,ra,TM_SHL);
    return;
  }
LAB_00130991:
  if ((long)uVar6 < 0) {
    if ((long)uVar6 < -0x3f) {
      pGVar4 = (GCObject *)0x0;
    }
    else {
      pGVar4 = (GCObject *)((ulong)pTVar5 >> ((ulong)(byte)-(char)uVar6 & 0x3f));
    }
  }
  else {
    pGVar4 = (GCObject *)0x0;
    if ((long)uVar6 < 0x40) {
      pGVar4 = (GCObject *)((long)pTVar5 << (uVar6 & 0x3f));
    }
  }
  (ra->value_).gc = pGVar4;
  ra->tt_ = 0x13;
  return;
}

Assistant:

void raviV_op_shl(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Integer ib;
  lua_Integer ic;
  if (tointegerns(rb, &ib) && tointegerns(rc, &ic)) {
    setivalue(ra, luaV_shiftl(ib, ic));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_SHL);
  }
}